

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_atomic_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  bool bVar1;
  CompilerError *pCVar2;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar3;
  uint32_t result_type_00;
  uint32_t result_id_00;
  string local_d8;
  string local_b8;
  string local_98;
  _Node_iterator_base<unsigned_int,_false> local_78;
  undefined1 local_70;
  allocator local_61;
  string local_60;
  SPIRType *local_30;
  SPIRType *type;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  type = (SPIRType *)op;
  op_local._0_4_ = op1;
  op_local._4_4_ = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  local_30 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  bVar1 = type_is_floating_point(local_30);
  if (bVar1) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar2,"Floating point atomics requires Vulkan semantics.");
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->options).es & 1U) != 0) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar2,"Floating point atomics requires desktop GLSL.");
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"GL_EXT_shader_atomic_float",&local_61);
    require_extension_internal(this,&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  pVar3 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(&(this->super_Compiler).forced_temporaries,&op1_local);
  local_78._M_cur = (__node_type *)pVar3.first.super__Node_iterator_base<unsigned_int,_false>._M_cur
  ;
  local_70 = pVar3.second;
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  to_non_uniform_aware_expression_abi_cxx11_(&local_b8,this,op_local._4_4_);
  to_unpacked_expression_abi_cxx11_(&local_d8,this,(uint32_t)op_local,true);
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            (&local_98,(spirv_cross *)&type,(char **)0x4a488c,(char (*) [2])&local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
             (char (*) [3])&local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
             (char (*) [2])CONCAT44(result_id_00,result_type_00));
  emit_op(this,result_type_00,result_id_00,&local_98,false,false);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  Compiler::flush_all_atomic_capable_variables(&this->super_Compiler);
  return;
}

Assistant:

void CompilerGLSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op)
{
	auto &type = get<SPIRType>(result_type);
	if (type_is_floating_point(type))
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Floating point atomics requires Vulkan semantics.");
		if (options.es)
			SPIRV_CROSS_THROW("Floating point atomics requires desktop GLSL.");
		require_extension_internal("GL_EXT_shader_atomic_float");
	}

	forced_temporaries.insert(result_id);
	emit_op(result_type, result_id,
	        join(op, "(", to_non_uniform_aware_expression(op0), ", ",
	             to_unpacked_expression(op1), ")"), false);
	flush_all_atomic_capable_variables();
}